

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

size_t secp256k1_context_preallocated_size(uint flags)

{
  uint in_EDI;
  size_t ret;
  undefined4 in_stack_fffffffffffffff0;
  size_t local_8;
  
  if ((in_EDI & 0xff) == 1) {
    local_8 = 0xd0;
    if ((in_EDI & 0x100) != 0) {
      local_8 = 0x1000d0;
    }
  }
  else {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_EDI,in_stack_fffffffffffffff0),(char *)0xd0);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t secp256k1_context_preallocated_size(unsigned int flags) {
    size_t ret = ROUND_TO_ALIGN(sizeof(secp256k1_context));
    /* A return value of 0 is reserved as an indicator for errors when we call this function internally. */
    VERIFY_CHECK(ret != 0);

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&default_illegal_callback,
                                    "Invalid flags");
            return 0;
    }

    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        ret += SECP256K1_ECMULT_GEN_CONTEXT_PREALLOCATED_SIZE;
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        ret += SECP256K1_ECMULT_CONTEXT_PREALLOCATED_SIZE;
    }
    return ret;
}